

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_context.cpp
# Opt level: O2

Node * __thiscall
ccs::TallyBuildContext<ccs::AndTally>::traverse
          (TallyBuildContext<ccs::AndTally> *this,SelectorLeaf *selector)

{
  int iVar1;
  undefined4 extraout_var;
  Node *pNVar3;
  shared_ptr<ccs::AndTally> tally;
  set<std::shared_ptr<ccs::Tally>,_std::less<std::shared_ptr<ccs::Tally>_>,_std::allocator<std::shared_ptr<ccs::Tally>_>_>
  tallies;
  undefined1 local_90 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<ccs::AndTally,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2> local_60;
  _Rb_tree<std::shared_ptr<ccs::Tally>,_std::shared_ptr<ccs::Tally>,_std::_Identity<std::shared_ptr<ccs::Tally>_>,_std::less<std::shared_ptr<ccs::Tally>_>,_std::allocator<std::shared_ptr<ccs::Tally>_>_>
  local_50;
  Node *pNVar2;
  
  std::__shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,
             &(this->baseContext_).super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>
            );
  iVar1 = (*selector->_vptr_SelectorLeaf[2])(selector,&local_60);
  pNVar2 = (Node *)CONCAT44(extraout_var,iVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  pNVar3 = this->firstNode_;
  if (pNVar3 != pNVar2) {
    local_50._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_50._M_impl.super__Rb_tree_header._M_header;
    local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_50._M_impl.super__Rb_tree_header._M_header._M_right =
         local_50._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    __set_intersection<std::_Rb_tree_const_iterator<std::shared_ptr<ccs::AndTally>>,std::_Rb_tree_const_iterator<std::shared_ptr<ccs::AndTally>>,std::insert_iterator<std::set<std::shared_ptr<ccs::Tally>,std::less<std::shared_ptr<ccs::Tally>>,std::allocator<std::shared_ptr<ccs::Tally>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((pNVar3->andTallies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               &(pNVar3->andTallies_)._M_t._M_impl.super__Rb_tree_header,
               (pNVar2->andTallies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               &(pNVar2->andTallies_)._M_t._M_impl.super__Rb_tree_header,&local_50);
    if (local_50._M_impl.super__Rb_tree_header._M_node_count == 0) {
      std::make_shared<ccs::AndTally,ccs::Node&,ccs::Node&>((Node *)local_90,this->firstNode_);
      pNVar3 = this->firstNode_;
      std::__shared_ptr<ccs::AndTally,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_70,(__shared_ptr<ccs::AndTally,_(__gnu_cxx::_Lock_policy)2> *)local_90);
      std::
      _Rb_tree<std::shared_ptr<ccs::AndTally>,std::shared_ptr<ccs::AndTally>,std::_Identity<std::shared_ptr<ccs::AndTally>>,std::less<std::shared_ptr<ccs::AndTally>>,std::allocator<std::shared_ptr<ccs::AndTally>>>
      ::_M_insert_unique<std::shared_ptr<ccs::AndTally>const&>
                ((_Rb_tree<std::shared_ptr<ccs::AndTally>,std::shared_ptr<ccs::AndTally>,std::_Identity<std::shared_ptr<ccs::AndTally>>,std::less<std::shared_ptr<ccs::AndTally>>,std::allocator<std::shared_ptr<ccs::AndTally>>>
                  *)&pNVar3->andTallies_,(shared_ptr<ccs::AndTally> *)&local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
      std::__shared_ptr<ccs::AndTally,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<ccs::AndTally,_(__gnu_cxx::_Lock_policy)2> *)(local_90 + 0x10),
                 (__shared_ptr<ccs::AndTally,_(__gnu_cxx::_Lock_policy)2> *)local_90);
      std::
      _Rb_tree<std::shared_ptr<ccs::AndTally>,std::shared_ptr<ccs::AndTally>,std::_Identity<std::shared_ptr<ccs::AndTally>>,std::less<std::shared_ptr<ccs::AndTally>>,std::allocator<std::shared_ptr<ccs::AndTally>>>
      ::_M_insert_unique<std::shared_ptr<ccs::AndTally>const&>
                ((_Rb_tree<std::shared_ptr<ccs::AndTally>,std::shared_ptr<ccs::AndTally>,std::_Identity<std::shared_ptr<ccs::AndTally>>,std::less<std::shared_ptr<ccs::AndTally>>,std::allocator<std::shared_ptr<ccs::AndTally>>>
                  *)&pNVar2->andTallies_,(shared_ptr<ccs::AndTally> *)(local_90 + 0x10));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
      pNVar3 = (((Tally *)local_90._0_8_)->node_)._M_t.
               super___uniq_ptr_impl<ccs::Node,_std::default_delete<ccs::Node>_>._M_t.
               super__Tuple_impl<0UL,_ccs::Node_*,_std::default_delete<ccs::Node>_>.
               super__Head_base<0UL,_ccs::Node_*,_false>._M_head_impl;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
    }
    else {
      pNVar3 = *(Node **)(*(size_t *)(local_50._M_impl.super__Rb_tree_header._M_header._M_left + 1)
                         + 8);
    }
    std::
    _Rb_tree<std::shared_ptr<ccs::Tally>,_std::shared_ptr<ccs::Tally>,_std::_Identity<std::shared_ptr<ccs::Tally>_>,_std::less<std::shared_ptr<ccs::Tally>_>,_std::allocator<std::shared_ptr<ccs::Tally>_>_>
    ::~_Rb_tree(&local_50);
  }
  return pNVar3;
}

Assistant:

virtual Node &traverse(ast::SelectorLeaf &selector) {
    Node &secondNode = selector.traverse(baseContext_);

    // we've arrived at the same node by two different paths. no tally is
    // actually needed here...
    if (&firstNode_ == &secondNode) return firstNode_;

    std::set<std::shared_ptr<Tally>> tallies;

    std::set_intersection(
        firstNode_.tallies<T>().begin(), firstNode_.tallies<T>().end(),
        secondNode.tallies<T>().begin(), secondNode.tallies<T>().end(),
        std::inserter(tallies, tallies.end()));

    // result will be either empty or have exactly one entry.

    if (tallies.empty()) {
      std::shared_ptr<T> tally = std::make_shared<T>(firstNode_,
          secondNode);
      firstNode_.addTally(tally);
      secondNode.addTally(tally);
      return tally->node();
    } else {
      return (*tallies.begin())->node();
    }
  }